

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O2

void DThinker::DestroyAllThinkers(void)

{
  FThinkerList *list;
  FThinkerList *list_00;
  int i;
  long lVar1;
  
  list = FreshThinkers;
  list_00 = Thinkers;
  lVar1 = 0;
  do {
    if (lVar1 != 4) {
      if (lVar1 == 0x80) {
        DestroyThinkersInList(Thinkers + 0x80);
        GC::FullGC();
        return;
      }
      DestroyThinkersInList(list_00);
      DestroyThinkersInList(list);
    }
    lVar1 = lVar1 + 1;
    list = list + 1;
    list_00 = list_00 + 1;
  } while( true );
}

Assistant:

void DThinker::DestroyAllThinkers ()
{
	int i;

	for (i = 0; i <= MAX_STATNUM; i++)
	{
		if (i != STAT_TRAVELLING)
		{
			DestroyThinkersInList (Thinkers[i]);
			DestroyThinkersInList (FreshThinkers[i]);
		}
	}
	DestroyThinkersInList (Thinkers[MAX_STATNUM+1]);
	GC::FullGC();
}